

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem>
          (QGenericArrayOps<QDockAreaLayoutItem> *this,qsizetype i,QDockAreaLayoutItem *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QPlaceHolderItem *in_RSI;
  QDockAreaLayoutItem *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QDockAreaLayoutItem tmp;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff66;
  byte bVar6;
  GrowthPosition where;
  Inserter local_80;
  undefined1 local_30 [40];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QDockAreaLayoutItem>::needsDetach
                    ((QArrayDataPointer<QDockAreaLayoutItem> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->placeHolderItem) &&
       (qVar3 = QArrayDataPointer<QDockAreaLayoutItem>::freeSpaceAtEnd
                          ((QArrayDataPointer<QDockAreaLayoutItem> *)in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QDockAreaLayoutItem>::end
                ((QArrayDataPointer<QDockAreaLayoutItem> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      QDockAreaLayoutItem::QDockAreaLayoutItem
                ((QDockAreaLayoutItem *)
                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff66,
                                         CONCAT24(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60))),in_RDI);
      in_RDI->placeHolderItem =
           (QPlaceHolderItem *)((long)&(in_RDI->placeHolderItem->objectName).d.d + 1);
      goto LAB_005840b2;
    }
    if ((in_RSI == (QPlaceHolderItem *)0x0) &&
       (qVar3 = QArrayDataPointer<QDockAreaLayoutItem>::freeSpaceAtBegin
                          ((QArrayDataPointer<QDockAreaLayoutItem> *)in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QDockAreaLayoutItem>::begin
                ((QArrayDataPointer<QDockAreaLayoutItem> *)0x583f7a);
      QDockAreaLayoutItem::QDockAreaLayoutItem
                ((QDockAreaLayoutItem *)
                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff66,
                                         CONCAT24(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60))),in_RDI);
      in_RDI->subinfo = (QDockAreaLayoutInfo *)&in_RDI->subinfo[-1].item_list.d.ptr;
      in_RDI->placeHolderItem =
           (QPlaceHolderItem *)((long)&(in_RDI->placeHolderItem->objectName).d.d + 1);
      goto LAB_005840b2;
    }
  }
  memset(local_30,0xaa,0x28);
  QDockAreaLayoutItem::QDockAreaLayoutItem
            ((QDockAreaLayoutItem *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)))
             ,in_RDI);
  bVar4 = in_RDI->placeHolderItem != (QPlaceHolderItem *)0x0;
  uVar5 = bVar4 && in_RSI == (QPlaceHolderItem *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QPlaceHolderItem *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QDockAreaLayoutItem>::detachAndGrow
            ((QArrayDataPointer<QDockAreaLayoutItem> *)in_RSI,where,
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff64,uVar2))),
             (QDockAreaLayoutItem **)in_RDI,
             (QArrayDataPointer<QDockAreaLayoutItem> *)CONCAT17(uVar5,in_stack_ffffffffffffff50));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QDockAreaLayoutItem> *)in_RDI);
    Inserter::insertOne((Inserter *)
                        CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff64,uVar2))),
                        (qsizetype)in_RDI,
                        (QDockAreaLayoutItem *)CONCAT17(uVar5,in_stack_ffffffffffffff50));
    Inserter::~Inserter(&local_80);
  }
  else {
    QArrayDataPointer<QDockAreaLayoutItem>::begin
              ((QArrayDataPointer<QDockAreaLayoutItem> *)0x584042);
    QDockAreaLayoutItem::QDockAreaLayoutItem
              ((QDockAreaLayoutItem *)
               CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff64,uVar2))),in_RDI);
    in_RDI->subinfo = (QDockAreaLayoutInfo *)&in_RDI->subinfo[-1].item_list.d.ptr;
    in_RDI->placeHolderItem =
         (QPlaceHolderItem *)((long)&(in_RDI->placeHolderItem->objectName).d.d + 1);
  }
  QDockAreaLayoutItem::~QDockAreaLayoutItem
            ((QDockAreaLayoutItem *)
             CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff64,uVar2))));
LAB_005840b2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }